

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O0

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool local_71;
  shared_ptr<SchemeObject> local_68 [2];
  shared_ptr<SchemeObject> local_48;
  uint local_34;
  undefined1 local_30 [8];
  shared_ptr<SchemeSymbol> s;
  shared_ptr<SchemePair> *np_local;
  shared_ptr<SchemeEnvironment> *env_local;
  
  s.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)np;
  do {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)np);
    local_71 = false;
    if (bVar1) {
      local_71 = std::operator!=(np,&scheme_nil);
    }
    if (local_71 == false) {
      env_local._7_1_ = 1;
      break;
    }
    std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)np);
    std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>((shared_ptr<SchemeObject> *)local_30);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)env);
      peVar3 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      std::shared_ptr<SchemeObject>::shared_ptr(&local_48,(nullptr_t)0x0);
      Context::set(&peVar2->context,&peVar3->value,&local_48);
      std::shared_ptr<SchemeObject>::~shared_ptr(&local_48);
      std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)np);
      std::dynamic_pointer_cast<SchemePair,SchemeObject>(local_68);
      std::shared_ptr<SchemePair>::operator=(np,(shared_ptr<SchemePair> *)local_68);
      std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_68);
    }
    else {
      env_local._7_1_ = 0;
    }
    local_34 = (uint)!bVar1;
    std::shared_ptr<SchemeSymbol>::~shared_ptr((shared_ptr<SchemeSymbol> *)local_30);
  } while (local_34 == 0);
  return (bool)(env_local._7_1_ & 1);
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np)
{
    while(np && np != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, nullptr);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
    }
    return true;
}